

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
vk::BinaryRegistryDetail::anon_unknown_8::getSearchPath
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ProgramIdentifier *id)

{
  allocator_type local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string combinedStr;
  
  std::operator+(&local_58,&id->testCasePath,'#');
  std::operator+(&combinedStr,&local_58,&id->programName);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(combinedStr._M_string_length >> 2) + 1,
             (value_type_conflict1 *)&local_58,&local_59);
  memcpy((__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_start,combinedStr._M_dataplus._M_p,
         combinedStr._M_string_length);
  std::__cxx11::string::~string((string *)&combinedStr);
  return __return_storage_ptr__;
}

Assistant:

std::vector<deUint32> getSearchPath (const ProgramIdentifier& id)
{
	const std::string	combinedStr		= id.testCasePath + '#' + id.programName;
	const size_t		strLen			= combinedStr.size();
	const size_t		numWords		= strLen/4 + 1;		// Must always end up with at least one 0 byte
	vector<deUint32>	words			(numWords, 0u);

	deMemcpy(&words[0], combinedStr.c_str(), strLen);

	return words;
}